

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  int iVar1;
  LogMessage *pLVar2;
  pair<char_*,_bool> pVar3;
  LogMessage local_60;
  Voidify local_49;
  char *local_48;
  undefined1 local_40;
  char *local_38;
  pair<char_*,_bool> z;
  int size_local;
  string *buffer_local;
  CodedInputStream *this_local;
  
  if (size < 0) {
    this_local._7_1_ = false;
  }
  else {
    z._12_4_ = size;
    iVar1 = BufferSize(this);
    if (iVar1 < (int)z._12_4_) {
      this_local._7_1_ = ReadStringFallback(this,buffer,z._12_4_);
    }
    else {
      absl::lts_20250127::strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
                (buffer,(long)(int)z._12_4_);
      pVar3 = as_string_data(buffer);
      local_48 = pVar3.first;
      local_40 = pVar3.second;
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_38 = local_48;
        z.first._0_1_ = local_40;
        if (local_48 == (char *)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_60,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                     ,0x108,"z.first != nullptr");
          pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar2);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_60);
        }
        memcpy(local_48,this->buffer_,(long)(int)z._12_4_);
        Advance(this,z._12_4_);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::ReadString(std::string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied

  if (BufferSize() >= size) {
    absl::strings_internal::STLStringResizeUninitialized(buffer, size);
    std::pair<char*, bool> z = as_string_data(buffer);
    if (z.second) {
      // Oddly enough, memcpy() requires its first two args to be non-NULL even
      // if we copy 0 bytes.  So, we have ensured that z.first is non-NULL here.
      ABSL_DCHECK(z.first != nullptr);
      memcpy(z.first, buffer_, size);
      Advance(size);
    }
    return true;
  }

  return ReadStringFallback(buffer, size);
}